

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnu_gettext.h
# Opt level: O0

void __thiscall booster::locale::gnu_gettext::messages_info::messages_info(messages_info *this)

{
  string *in_RDI;
  function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  allocator local_1d [20];
  allocator local_9 [9];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"C",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  this_00 = (function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)(in_RDI + 0x20);
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::string(in_RDI + 0x40);
  std::__cxx11::string::string(in_RDI + 0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x80,"LC_MESSAGES",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  std::
  vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
  ::vector((vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
            *)0x270422);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x270433);
  std::
  function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this_00);
  return;
}

Assistant:

messages_info() :
            language("C"),
            locale_category("LC_MESSAGES")
        {
        }